

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# defaultShaders.cpp
# Opt level: O0

string * __thiscall
vera::getDefaultSrc_abi_cxx11_(string *__return_storage_ptr__,vera *this,DefaultShaders _type)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_88;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_68;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_48;
  undefined1 local_15;
  int local_14;
  string *psStack_10;
  DefaultShaders _type_local;
  string *rta;
  
  local_14 = (int)this;
  local_15 = 0;
  psStack_10 = __return_storage_ptr__;
  std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)versionLine_abi_cxx11_);
  if (local_14 == 0) {
    if (versionNumber < 0x82) {
      std::__cxx11::string::operator+=
                ((string *)__return_storage_ptr__,(string *)&default_vert_abi_cxx11_);
    }
    else if (0x81 < versionNumber) {
      std::__cxx11::string::operator+=
                ((string *)__return_storage_ptr__,(string *)&default_vert_300_abi_cxx11_);
    }
  }
  else if (local_14 == 1) {
    std::__cxx11::string::operator+=
              ((string *)__return_storage_ptr__,(string *)&default_frag_abi_cxx11_);
  }
  else if (local_14 == 2) {
    std::__cxx11::string::operator+=
              ((string *)__return_storage_ptr__,(string *)&default_texture_frag_abi_cxx11_);
  }
  else if (local_14 == 3) {
    if (versionNumber < 0x82) {
      std::__cxx11::string::operator+=
                ((string *)__return_storage_ptr__,(string *)&default_scene_vert_abi_cxx11_);
    }
    else if (0x81 < versionNumber) {
      std::__cxx11::string::operator+=
                ((string *)__return_storage_ptr__,(string *)&default_scene_vert_300_abi_cxx11_);
    }
  }
  else if (local_14 == 4) {
    std::operator+(&local_88,&default_scene_frag0_abi_cxx11_,&default_scene_frag1_abi_cxx11_);
    std::operator+(&local_68,&local_88,&default_scene_frag2_abi_cxx11_);
    std::operator+(&local_48,&local_68,&default_scene_frag3_abi_cxx11_);
    std::__cxx11::string::operator+=((string *)__return_storage_ptr__,(string *)&local_48);
    std::__cxx11::string::~string((string *)&local_48);
    std::__cxx11::string::~string((string *)&local_68);
    std::__cxx11::string::~string((string *)&local_88);
  }
  else if (local_14 == 5) {
    if (versionNumber < 0x82) {
      std::__cxx11::string::operator+=
                ((string *)__return_storage_ptr__,(string *)&billboard_vert_abi_cxx11_);
    }
    else if (0x81 < versionNumber) {
      std::__cxx11::string::operator+=
                ((string *)__return_storage_ptr__,(string *)&billboard_vert_300_abi_cxx11_);
    }
  }
  else if (local_14 == 6) {
    if (versionNumber < 0x82) {
      std::__cxx11::string::operator+=
                ((string *)__return_storage_ptr__,(string *)&dynamic_billboard_vert_abi_cxx11_);
    }
    else if (0x81 < versionNumber) {
      std::__cxx11::string::operator+=
                ((string *)__return_storage_ptr__,(string *)&dynamic_billboard_vert_300_abi_cxx11_);
    }
  }
  else if (local_14 == 7) {
    if (versionNumber < 0x82) {
      std::__cxx11::string::operator+=
                ((string *)__return_storage_ptr__,(string *)&dynamic_billboard_frag_abi_cxx11_);
    }
    else if (0x81 < versionNumber) {
      std::__cxx11::string::operator+=
                ((string *)__return_storage_ptr__,(string *)&dynamic_billboard_frag_300_abi_cxx11_);
    }
  }
  else if (local_14 == 8) {
    if (versionNumber < 0x82) {
      std::__cxx11::string::operator+=
                ((string *)__return_storage_ptr__,(string *)&cube_vert_abi_cxx11_);
    }
    else if (0x81 < versionNumber) {
      std::__cxx11::string::operator+=
                ((string *)__return_storage_ptr__,(string *)&cube_vert_300_abi_cxx11_);
    }
  }
  else if (local_14 == 9) {
    if (versionNumber < 0x82) {
      std::__cxx11::string::operator+=
                ((string *)__return_storage_ptr__,(string *)&cube_frag_abi_cxx11_);
    }
    else if (0x81 < versionNumber) {
      std::__cxx11::string::operator+=
                ((string *)__return_storage_ptr__,(string *)&cube_frag_300_abi_cxx11_);
    }
  }
  else if (local_14 == 10) {
    if (versionNumber < 0x82) {
      std::__cxx11::string::operator+=
                ((string *)__return_storage_ptr__,(string *)&error_vert_abi_cxx11_);
    }
    else if (0x81 < versionNumber) {
      std::__cxx11::string::operator+=
                ((string *)__return_storage_ptr__,(string *)&error_vert_300_abi_cxx11_);
    }
  }
  else if (local_14 == 0xb) {
    if (versionNumber < 0x82) {
      std::__cxx11::string::operator+=
                ((string *)__return_storage_ptr__,(string *)&error_frag_abi_cxx11_);
    }
    else if (0x81 < versionNumber) {
      std::__cxx11::string::operator+=
                ((string *)__return_storage_ptr__,(string *)&error_frag_300_abi_cxx11_);
    }
  }
  else if (local_14 == 0xc) {
    if (versionNumber < 0x82) {
      std::__cxx11::string::operator+=
                ((string *)__return_storage_ptr__,(string *)&light_vert_abi_cxx11_);
    }
    else if (0x81 < versionNumber) {
      std::__cxx11::string::operator+=
                ((string *)__return_storage_ptr__,(string *)&light_vert_300_abi_cxx11_);
    }
  }
  else if (local_14 == 0xd) {
    if (versionNumber < 0x82) {
      std::__cxx11::string::operator+=
                ((string *)__return_storage_ptr__,(string *)&light_frag_abi_cxx11_);
    }
    else if (0x81 < versionNumber) {
      std::__cxx11::string::operator+=
                ((string *)__return_storage_ptr__,(string *)&light_frag_300_abi_cxx11_);
    }
  }
  else if (local_14 == 0xe) {
    if (versionNumber < 0x82) {
      std::__cxx11::string::operator+=
                ((string *)__return_storage_ptr__,(string *)&fill_vert_abi_cxx11_);
    }
    else if (0x81 < versionNumber) {
      std::__cxx11::string::operator+=
                ((string *)__return_storage_ptr__,(string *)&fill_vert_300_abi_cxx11_);
    }
  }
  else if (local_14 == 0xf) {
    if (versionNumber < 0x82) {
      std::__cxx11::string::operator+=
                ((string *)__return_storage_ptr__,(string *)&fill_frag_abi_cxx11_);
    }
    else if (0x81 < versionNumber) {
      std::__cxx11::string::operator+=
                ((string *)__return_storage_ptr__,(string *)&fill_frag_300_abi_cxx11_);
    }
  }
  else if (local_14 == 0x10) {
    if (versionNumber < 0x82) {
      std::__cxx11::string::operator+=
                ((string *)__return_storage_ptr__,(string *)&points_vert_abi_cxx11_);
    }
    else if (0x81 < versionNumber) {
      std::__cxx11::string::operator+=
                ((string *)__return_storage_ptr__,(string *)&points_vert_300_abi_cxx11_);
    }
  }
  else if (local_14 == 0x11) {
    if (versionNumber < 0x82) {
      std::__cxx11::string::operator+=
                ((string *)__return_storage_ptr__,(string *)&points_frag_abi_cxx11_);
    }
    else if (0x81 < versionNumber) {
      std::__cxx11::string::operator+=
                ((string *)__return_storage_ptr__,(string *)&points_frag_300_abi_cxx11_);
    }
  }
  else if (local_14 == 0x12) {
    if (versionNumber < 0x82) {
      std::__cxx11::string::operator+=
                ((string *)__return_storage_ptr__,(string *)&default_buffer_position_abi_cxx11_);
    }
    else if (0x81 < versionNumber) {
      std::__cxx11::string::operator+=
                ((string *)__return_storage_ptr__,(string *)&default_buffer_position_300_abi_cxx11_)
      ;
    }
  }
  else if (local_14 == 0x13) {
    if (versionNumber < 0x82) {
      std::__cxx11::string::operator+=
                ((string *)__return_storage_ptr__,(string *)&default_buffer_normal_abi_cxx11_);
    }
    else if (0x81 < versionNumber) {
      std::__cxx11::string::operator+=
                ((string *)__return_storage_ptr__,(string *)&default_buffer_normal_300_abi_cxx11_);
    }
  }
  else if (local_14 == 0x14) {
    if (versionNumber < 0x82) {
      std::__cxx11::string::operator+=
                ((string *)__return_storage_ptr__,(string *)&plot_frag_abi_cxx11_);
    }
    else if (0x81 < versionNumber) {
      std::__cxx11::string::operator+=
                ((string *)__return_storage_ptr__,(string *)&plot_frag_300_abi_cxx11_);
    }
  }
  else if (local_14 == 0x15) {
    if (versionNumber < 0x82) {
      std::__cxx11::string::operator+=
                ((string *)__return_storage_ptr__,(string *)&fxaa_frag_abi_cxx11_);
    }
    else if (0x81 < versionNumber) {
      std::__cxx11::string::operator+=
                ((string *)__return_storage_ptr__,(string *)&fxaa_frag_300_abi_cxx11_);
    }
  }
  else if (local_14 == 0x16) {
    if (versionNumber < 0x82) {
      std::__cxx11::string::operator+=
                ((string *)__return_storage_ptr__,(string *)&poissonfill_frag_abi_cxx11_);
    }
    else if (0x81 < versionNumber) {
      std::__cxx11::string::operator+=
                ((string *)__return_storage_ptr__,(string *)&poissonfill_frag_300_abi_cxx11_);
    }
  }
  else if (local_14 == 0x17) {
    if (versionNumber < 0x82) {
      std::__cxx11::string::operator+=
                ((string *)__return_storage_ptr__,(string *)&jumpflood_frag_abi_cxx11_);
    }
    else if (0x81 < versionNumber) {
      std::__cxx11::string::operator+=
                ((string *)__return_storage_ptr__,(string *)&jumpflood_frag_300_abi_cxx11_);
    }
  }
  else if (local_14 == 0x18) {
    if (versionNumber < 0x82) {
      std::__cxx11::string::operator+=
                ((string *)__return_storage_ptr__,(string *)&devlook_billboard_vert_abi_cxx11_);
    }
    else if (0x81 < versionNumber) {
      std::__cxx11::string::operator+=
                ((string *)__return_storage_ptr__,(string *)&devlook_billboard_vert_300_abi_cxx11_);
    }
  }
  else if (local_14 == 0x19) {
    if (versionNumber < 0x82) {
      std::__cxx11::string::operator+=
                ((string *)__return_storage_ptr__,(string *)&devlook_sphere_vert_abi_cxx11_);
    }
    else if (0x81 < versionNumber) {
      std::__cxx11::string::operator+=
                ((string *)__return_storage_ptr__,(string *)&devlook_sphere_vert_300_abi_cxx11_);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

std::string getDefaultSrc( DefaultShaders _type ) {
    std::string rta = versionLine;

    if (_type == VERT_DEFAULT) {
        if (versionNumber < 130)
            rta += default_vert;
        else if (versionNumber >= 130) 
            rta += default_vert_300;
    }
    else if (_type == FRAG_DEFAULT) {
        rta += default_frag;
    }
    else if (_type == FRAG_DEFAULT_TEXTURE) {
        rta += default_texture_frag;
    }
    else if (_type == VERT_DEFAULT_SCENE) {
        if (versionNumber < 130)
            rta += default_scene_vert;
        else if (versionNumber >= 130) 
            rta += default_scene_vert_300;
    }
    else if (_type == FRAG_DEFAULT_SCENE) {
        rta += default_scene_frag0 + default_scene_frag1 + default_scene_frag2 + default_scene_frag3;
    }
    else if (_type == VERT_BILLBOARD) {
        if (versionNumber < 130)
            rta += billboard_vert;
        else if (versionNumber >= 130) 
            rta += billboard_vert_300;
    }
    else if (_type == VERT_DYNAMIC_BILLBOARD) {
        if (versionNumber < 130)
            rta += dynamic_billboard_vert;
        else if (versionNumber >= 130) 
            rta += dynamic_billboard_vert_300;
    }
    else if (_type == FRAG_DYNAMIC_BILLBOARD) {
        if (versionNumber < 130)
            rta += dynamic_billboard_frag;
        else if (versionNumber >= 130) 
            rta += dynamic_billboard_frag_300;
    }
    else if (_type == VERT_CUBEMAP) {
        if (versionNumber < 130)
            rta += cube_vert;
        else if (versionNumber >= 130) 
            rta += cube_vert_300;
    }
    else if (_type == FRAG_CUBEMAP) {
        if (versionNumber < 130)
            rta += cube_frag;
        else if (versionNumber >= 130) 
            rta += cube_frag_300;
    }
    else if (_type == VERT_ERROR) {
        if (versionNumber < 130)
            rta += error_vert;
        else if (versionNumber >= 130) 
            rta += error_vert_300;
    }
    else if (_type == FRAG_ERROR) {
        if (versionNumber < 130)
            rta += error_frag;
        else if (versionNumber >= 130) 
            rta += error_frag_300;
    }
    else if (_type == VERT_LIGHT) {
        if (versionNumber < 130)
            rta += light_vert;
        else if (versionNumber >= 130) 
            rta += light_vert_300;
    }
    else if (_type == FRAG_LIGHT) {
        if (versionNumber < 130)
            rta += light_frag;
        else if (versionNumber >= 130) 
            rta += light_frag_300;
    }

    else if (_type == VERT_FILL) {
        if (versionNumber < 130)
            rta += fill_vert;
        else if (versionNumber >= 130) 
            rta += fill_vert_300;
    }
    else if (_type == FRAG_FILL) {
        if (versionNumber < 130)
            rta += fill_frag;
        else if (versionNumber >= 130) 
            rta += fill_frag_300;
    }

    else if (_type == VERT_POINTS) {
        if (versionNumber < 130)
            rta += points_vert;
        else if (versionNumber >= 130) 
            rta += points_vert_300;
    }
    else if (_type == FRAG_POINTS) {
        if (versionNumber < 130)
            rta += points_frag;
        else if (versionNumber >= 130) 
            rta += points_frag_300;
    }

    else if (_type == FRAG_POSITION) {
        if (versionNumber < 130)
            rta += default_buffer_position;
        else if (versionNumber >= 130) 
            rta += default_buffer_position_300;
    }
    else if (_type == FRAG_NORMAL) {
        if (versionNumber < 130)
            rta += default_buffer_normal;
        else if (versionNumber >= 130) 
            rta += default_buffer_normal_300;
    }

    else if (_type == FRAG_PLOT) {
        if (versionNumber < 130)
            rta += plot_frag;
        else if (versionNumber >= 130) 
            rta += plot_frag_300;
    }
    else if (_type == FRAG_FXAA) {
        if (versionNumber < 130)
            rta += fxaa_frag;
        else if (versionNumber >= 130) 
            rta += fxaa_frag_300;
    }
    else if (_type == FRAG_POISSONFILL) {
        if (versionNumber < 130)
            rta += poissonfill_frag;
        else if (versionNumber >= 130) 
            rta += poissonfill_frag_300;
    } 
    else if (_type == FRAG_JUMPFLOOD) {
        if (versionNumber < 130)
            rta += jumpflood_frag;
        else if (versionNumber >= 130) 
            rta += jumpflood_frag_300;
    }
    else if (_type == VERT_DEVLOOK_BILLBOARD) {
        if (versionNumber < 130)
            rta += devlook_billboard_vert;
        else if (versionNumber >= 130) 
            rta += devlook_billboard_vert_300;
    }
    else if (_type == VERT_DEVLOOK_SPHERE) {
        if (versionNumber < 130)
            rta += devlook_sphere_vert;
        else if (versionNumber >= 130) 
            rta += devlook_sphere_vert_300;
    }

    return rta;
}